

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  LogMessage *pLVar4;
  size_t sVar5;
  LogMessage local_128;
  LogMessage local_f0;
  LogMessage local_b8;
  undefined8 local_80;
  undefined8 local_78;
  char *localized_endptr;
  char *local_60;
  char *temp_endptr;
  string localized;
  
  localized.field_2._8_8_ = strtod(str,&local_60);
  if (endptr != (char **)0x0) {
    *endptr = local_60;
  }
  if (*local_60 == '.') {
    local_80 = endptr;
    iVar3 = snprintf((char *)&local_78,0x10,"%.1f",0x3ff8000000000000);
    if ((char)local_78 != '1') {
      LogMessage::LogMessage
                (&local_128,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x982);
      pLVar4 = LogMessage::operator<<(&local_128,"CHECK failed: (temp[0]) == (\'1\'): ");
      LogFinisher::operator=((LogFinisher *)&local_b8,pLVar4);
      LogMessage::~LogMessage(&local_128);
    }
    if (*(char *)((long)&local_78 + (long)iVar3 + -1) != '5') {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x983);
      pLVar4 = LogMessage::operator<<(&local_b8,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      LogFinisher::operator=((LogFinisher *)&local_f0,pLVar4);
      LogMessage::~LogMessage(&local_b8);
    }
    if (6 < iVar3) {
      LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x984);
      pLVar4 = LogMessage::operator<<(&local_f0,"CHECK failed: (size) <= (6): ");
      LogFinisher::operator=((LogFinisher *)&temp_endptr,pLVar4);
      LogMessage::~LogMessage(&local_f0);
    }
    temp_endptr = (char *)&localized._M_string_length;
    localized._M_dataplus._M_p = (pointer)0x0;
    localized._M_string_length._0_1_ = 0;
    strlen(str);
    std::__cxx11::string::reserve((ulong)&temp_endptr);
    std::__cxx11::string::replace
              ((ulong)&temp_endptr,(ulong)localized._M_dataplus._M_p,(char *)0x0,(ulong)str);
    std::__cxx11::string::append((char *)&temp_endptr,(long)&local_78 + 1);
    std::__cxx11::string::append((char *)&temp_endptr);
    pcVar2 = temp_endptr;
    localized.field_2._8_8_ = strtod(temp_endptr,(char **)&local_78);
    ppcVar1 = local_80;
    if ((local_80 != (char **)0x0) &&
       ((long)local_60 - (long)str < CONCAT71(local_78._1_7_,(char)local_78) - (long)pcVar2)) {
      iVar3 = (int)localized._M_dataplus._M_p;
      sVar5 = strlen(str);
      *ppcVar1 = str + (CONCAT71(local_78._1_7_,(char)local_78) -
                       (long)(pcVar2 + (iVar3 - (int)sVar5)));
    }
    if ((size_type *)temp_endptr != &localized._M_string_length) {
      operator_delete(temp_endptr);
    }
  }
  return (double)localized.field_2._8_8_;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}